

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  iterator *piVar1;
  Value *pVVar2;
  ValueHolder *pVVar3;
  TokenType TVar4;
  bool bVar5;
  char *pcVar6;
  _Elt_pointer ppVVar7;
  Value numberName;
  string name;
  Token comma;
  Token colon;
  Token tokenName;
  ValueHolder local_f0;
  ushort local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined8 local_d0;
  string local_c8;
  Token local_a8;
  string local_90;
  Token local_70;
  ValueHolder local_58;
  ushort local_50;
  undefined8 local_48;
  size_t local_40;
  size_t sStack_38;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_48 = 0;
  pcVar6 = (char *)operator_new(0x30);
  pcVar6[0x10] = '\0';
  pcVar6[0x11] = '\0';
  pcVar6[0x12] = '\0';
  pcVar6[0x13] = '\0';
  pcVar6[0x14] = '\0';
  pcVar6[0x15] = '\0';
  pcVar6[0x16] = '\0';
  pcVar6[0x17] = '\0';
  pcVar6[0x18] = '\0';
  pcVar6[0x19] = '\0';
  pcVar6[0x1a] = '\0';
  pcVar6[0x1b] = '\0';
  pcVar6[0x1c] = '\0';
  pcVar6[0x1d] = '\0';
  pcVar6[0x1e] = '\0';
  pcVar6[0x1f] = '\0';
  pcVar6[0] = '\0';
  pcVar6[1] = '\0';
  pcVar6[2] = '\0';
  pcVar6[3] = '\0';
  pcVar6[4] = '\0';
  pcVar6[5] = '\0';
  pcVar6[6] = '\0';
  pcVar6[7] = '\0';
  pcVar6[8] = '\0';
  pcVar6[9] = '\0';
  pcVar6[10] = '\0';
  pcVar6[0xb] = '\0';
  pcVar6[0xc] = '\0';
  pcVar6[0xd] = '\0';
  pcVar6[0xe] = '\0';
  pcVar6[0xf] = '\0';
  *(char **)(pcVar6 + 0x18) = pcVar6 + 8;
  *(char **)(pcVar6 + 0x20) = pcVar6 + 8;
  pcVar6[0x28] = '\0';
  pcVar6[0x29] = '\0';
  pcVar6[0x2a] = '\0';
  pcVar6[0x2b] = '\0';
  pcVar6[0x2c] = '\0';
  pcVar6[0x2d] = '\0';
  pcVar6[0x2e] = '\0';
  pcVar6[0x2f] = '\0';
  ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar7 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar2 = ppVVar7[-1];
  local_50 = *(ushort *)&pVVar2->field_0x8;
  local_58.map_ = *(ObjectValues **)&pVVar2->value_;
  (pVVar2->value_).string_ = pcVar6;
  *(ushort *)&pVVar2->field_0x8 = local_50 & 0xfe00 | 7;
  local_50 = local_50 & 0x1ff;
  local_40 = pVVar2->start_;
  sStack_38 = pVVar2->limit_;
  pVVar2->start_ = 0;
  pVVar2->limit_ = 0;
  Value::~Value((Value *)&local_58);
  ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar7 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar7[-1]->start_ = (long)tokenStart->start_ - (long)this->begin_;
  do {
    readToken(this,&local_70);
    while (TVar4 = local_70.type_, local_70.type_ == tokenComment) {
      readToken(this,&local_70);
    }
    if ((local_70.type_ == tokenObjectEnd) && ((char *)local_c8._M_string_length == (char *)0x0))
    break;
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x119c48);
    if (TVar4 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ == true) {
        local_e8 = local_e8 & 0xfe00;
        local_e0._M_allocated_capacity = 0;
        local_e0._8_8_ = 0;
        local_d0 = 0;
        bVar5 = decodeNumber(this,&local_70,(Value *)&local_f0);
        if (bVar5) {
          Value::asString_abi_cxx11_(&local_90,(Value *)&local_f0);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p) !=
              &local_90.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p)
                           );
          }
          Value::~Value((Value *)&local_f0);
          goto LAB_0010cd9a;
        }
        recoverFromError(this,tokenObjectEnd);
        Value::~Value((Value *)&local_f0);
        goto LAB_0010cf87;
      }
LAB_0010ce6f:
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \'}\' or object member name","");
      addError(this,(string *)&local_f0,&local_70,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
LAB_0010cf73:
      if (local_f0 != &local_e0) {
        operator_delete(local_f0.string_);
      }
LAB_0010cf87:
      bVar5 = false;
      goto LAB_0010cf89;
    }
    if (TVar4 != tokenString) goto LAB_0010ce6f;
    bVar5 = decodeString(this,&local_70,&local_c8);
    if (!bVar5) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010cf87;
    }
LAB_0010cd9a:
    readToken(this,(Token *)&local_90);
    if ((int)local_90._M_dataplus._M_p != 0xb) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \':\' after object member name","");
      addError(this,(string *)&local_f0,(Token *)&local_90,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010cf73;
    }
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_f0.map_ =
         (ObjectValues *)Value::resolveReference(ppVVar7[-1],local_c8._M_dataplus._M_p,false);
    pVVar3 = (ValueHolder *)
             (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pVVar3 == (ValueHolder *)
                  ((this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
      std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_f0.map_);
    }
    else {
      pVVar3->map_ = (ObjectValues *)local_f0;
      piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    bVar5 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar5) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010cf87;
    }
    readToken(this,&local_a8);
    if ((tokenComment < local_a8.type_) || ((0x1404U >> (local_a8.type_ & 0x1f) & 1) == 0)) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \',\' or \'}\' in object declaration","");
      addError(this,(string *)&local_f0,&local_a8,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010cf73;
    }
    while (local_a8.type_ == tokenComment) {
      readToken(this,&local_a8);
    }
  } while (local_a8.type_ != tokenObjectEnd);
  bVar5 = true;
LAB_0010cf89:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return bVar5;
}

Assistant:

bool Reader::readObject(Token& tokenStart) {
  Token tokenName;
  std::string name;
  currentValue() = Value(objectValue);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name = "";
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}